

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
AdapterPromiseNode<kj::AuthenticatedStream,_kj::(anonymous_namespace)::AggregateConnectionReceiver::Waiter>
::fulfill(AdapterPromiseNode<kj::AuthenticatedStream,_kj::(anonymous_namespace)::AggregateConnectionReceiver::Waiter>
          *this,AuthenticatedStream *value)

{
  AuthenticatedStream *value_00;
  ExceptionOr<kj::AuthenticatedStream> local_1d8;
  AuthenticatedStream *local_18;
  AuthenticatedStream *value_local;
  AdapterPromiseNode<kj::AuthenticatedStream,_kj::(anonymous_namespace)::AggregateConnectionReceiver::Waiter>
  *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = value;
    value_local = (AuthenticatedStream *)this;
    value_00 = mv<kj::AuthenticatedStream>(value);
    ExceptionOr<kj::AuthenticatedStream>::ExceptionOr(&local_1d8,value_00);
    ExceptionOr<kj::AuthenticatedStream>::operator=(&this->result,&local_1d8);
    ExceptionOr<kj::AuthenticatedStream>::~ExceptionOr(&local_1d8);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }